

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  _Setprecision _Var1;
  ostream *poVar2;
  double dVar3;
  __type _Var4;
  double to3;
  double from3;
  char **argv_local;
  int argc_local;
  
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  _Var1 = std::setprecision(0x3c);
  std::operator<<(poVar2,_Var1);
  dVar3 = std::numeric_limits<double>::epsilon();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  dVar3 = std::numeric_limits<double>::epsilon();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1.0 - dVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  dVar3 = std::numeric_limits<double>::epsilon();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,2.0 - dVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  dVar3 = std::numeric_limits<double>::epsilon();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,4.0 - (dVar3 + dVar3));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  dVar3 = std::numeric_limits<double>::epsilon();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,8.0 - (dVar3 + dVar3));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  dVar3 = std::numeric_limits<double>::epsilon();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,16.0 - dVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  dVar3 = std::numeric_limits<double>::epsilon();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,32.0 - dVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  dVar3 = std::numeric_limits<double>::epsilon();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,64.0 - dVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var4 = std::nextafter<double,int>(0.1,0);
  poVar2 = std::operator<<((ostream *)&std::cout,"The number 0.1 lies between two valid doubles:\n")
  ;
  _Var1 = std::setprecision(0x38);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,"    ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hexfloat);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var4);
  poVar2 = std::operator<<(poVar2,')');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::defaultfloat);
  poVar2 = std::operator<<(poVar2,"\nand ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0.1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hexfloat);
  poVar2 = std::operator<<(poVar2,"  (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0.1);
  poVar2 = std::operator<<(poVar2,")\n");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::defaultfloat);
  _Var1 = std::setprecision(0x14);
  std::operator<<(poVar2,_Var1);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

  /*
  Machine Epsilon is the machine-dependent  difference between 1.0 and the
  smallest representable value that is greater than 1.0.

  */

  std::cout << std::fixed << std::setprecision(60);
  std::cout << std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 1.0 - std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 2.0 - std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 4.0 - 2*std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 8.0 - 2*std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 16.0 - std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 32.0 - std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 64.0 - std::numeric_limits<double>::epsilon() << std::endl;

  double from3 = std::nextafter(0.1, 0), to3 = 0.1;
      std::cout << "The number 0.1 lies between two valid doubles:\n"
                << std::setprecision(56) << "    " << from3
                << std::hexfloat << " (" << from3 << ')' << std::defaultfloat
                << "\nand " << to3 << std::hexfloat << "  (" << to3 << ")\n"
                << std::defaultfloat << std::setprecision(20);



  return 0;
}